

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.cpp
# Opt level: O0

void __thiscall
camp::EnumNameNotFound::EnumNameNotFound(EnumNameNotFound *this,string *name,string *enumName)

{
  string local_80 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40 [32];
  string *local_20;
  string *enumName_local;
  string *name_local;
  EnumNameNotFound *this_local;
  
  local_20 = enumName;
  enumName_local = name;
  name_local = (string *)this;
  std::operator+((char *)local_80,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"the value ");
  std::operator+(local_60,(char *)local_80);
  std::operator+(local_40,local_60);
  Error::Error(&this->super_Error,local_40);
  std::__cxx11::string::~string((string *)local_40);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string(local_80);
  *(undefined ***)&this->super_Error = &PTR__EnumNameNotFound_001fd448;
  return;
}

Assistant:

EnumNameNotFound::EnumNameNotFound(const std::string& name, const std::string& enumName)
    : Error("the value " + name + " couldn't be found in metaenum " + enumName)
{
}